

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

void __thiscall
miniros::master::Master::Master(Master *this,shared_ptr<miniros::RPCManager> *manager)

{
  RegistrationManager *this_00;
  __shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data __tmp;
  
  this->m_port = -1;
  (this->m_host)._M_dataplus._M_p = (pointer)&(this->m_host).field_2;
  (this->m_host)._M_string_length = 0;
  (this->m_host).field_2._M_local_buf[0] = '\0';
  (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->m_regManager;
  RegistrationManager::RegistrationManager(this_00);
  ::std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_78,
             &manager->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>);
  MasterHandler::MasterHandler(&this->m_handler,(RPCManagerPtr *)&_Stack_78,this_00);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  ParameterStorage::ParameterStorage(&this->m_parameterStorage,this_00);
  ::std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_rpcManager).
              super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>,
             &manager->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__cxx11::string::assign((char *)&this->m_host);
  this->m_port = 0x2c2f;
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (Master::loc.initialized_ == false) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68._M_pod_data,"miniros.unknown_package",
               (allocator<char> *)__tmp._M_pod_data);
    console::initializeLogLocation(&Master::loc,(string *)&local_68,Warn);
    ::std::__cxx11::string::~string((string *)local_68._M_pod_data);
  }
  if (Master::loc.level_ != Warn) {
    console::setLogLocationLevel(&Master::loc,Warn);
    console::checkLogLocationEnabled(&Master::loc);
  }
  if (Master::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,Master::loc.logger_,Master::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                   ,0x17,"miniros::master::Master::Master(std::shared_ptr<RPCManager>)",
                   "Invalid XMLRPC uri. Using ROS_MASTER_URI=http://%s:%d",
                   (this->m_host)._M_dataplus._M_p,(ulong)(uint)this->m_port);
  }
  __tmp._8_8_ = 0;
  local_68._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor;
  local_68._8_8_ =
       *(undefined8 *)
        ((long)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor + 8);
  *(Master **)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor = this;
  *(undefined8 *)
   ((long)&(this->m_parameterStorage).paramUpdateFn.super__Function_base._M_functor + 8) = 0;
  local_58 = (this->m_parameterStorage).paramUpdateFn.super__Function_base._M_manager;
  p_Stack_50 = (this->m_parameterStorage).paramUpdateFn._M_invoker;
  (this->m_parameterStorage).paramUpdateFn.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(const_std::shared_ptr<miniros::master::NodeRef>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_XmlRpc::XmlRpcValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp:27:5)>
       ::_M_manager;
  (this->m_parameterStorage).paramUpdateFn._M_invoker =
       ::std::
       _Function_handler<void_(const_std::shared_ptr<miniros::master::NodeRef>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_XmlRpc::XmlRpcValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp:27:5)>
       ::_M_invoke;
  __tmp._M_unused._M_object = this;
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

Master::Master(std::shared_ptr<RPCManager> manager)
  : m_handler(manager, &m_regManager), m_parameterStorage(&m_regManager)
{
  m_rpcManager = manager;
  // TODO: Read environment.
  // split the URI (if it's valid) into host and port
  // if (!network.splitURI(ROS.ROS_MASTER_URI, ref _host, ref _port))
  {
    m_host = "localhost";
    m_port = 11311;
    MINIROS_WARN("Invalid XMLRPC uri. Using ROS_MASTER_URI=http://%s:%d", m_host.c_str(), m_port);
  }

  m_parameterStorage.paramUpdateFn =
    [this] (const std::shared_ptr<NodeRef>& nr, const std::string& fullPath, const RpcValue* value) {
      this->m_handler.sendToNode(nr, "paramUpdate", fullPath, value ? *value : RpcValue::Dict());
    };
}